

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O1

void __thiscall Downloader::Freeze(Downloader *this)

{
  size_t __nbytes;
  void *__buf;
  PackageList packagelist;
  CCDir ccdir;
  string local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  local_200;
  CCDir local_1d0;
  CCDir local_f0;
  
  get_compiler_abi_cxx11_(&local_220,this,false);
  MakeCCDir(&local_f0,this,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  local_200._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_200._M_impl.super__Rb_tree_header._M_header;
  local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  __nbytes = 0;
  local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200._M_impl.super__Rb_tree_header._M_header._M_right =
       local_200._M_impl.super__Rb_tree_header._M_header._M_left;
  CCDir::CCDir(&local_1d0,&local_f0);
  PackageList::read((PackageList *)&local_200,(int)&local_1d0,__buf,__nbytes);
  CCDir::~CCDir(&local_1d0);
  PackageList::freeze((PackageList *)&local_200);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  ::~_Rb_tree(&local_200);
  CCDir::~CCDir(&local_f0);
  return;
}

Assistant:

void Freeze(){
        CCDir ccdir=MakeCCDir(get_compiler(false));
        PackageList packagelist;
        packagelist.read(ccdir);
        packagelist.freeze();
    }